

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTest.cpp
# Opt level: O0

void __thiscall PathTest::PartsTest(PathTest *this)

{
  undefined4 uVar1;
  bool bVar2;
  undefined8 uVar3;
  string local_148 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  Path local_88;
  Path local_58;
  undefined1 local_38 [8];
  Path p;
  int i;
  PathTest *this_local;
  
  for (p.mPath.field_2._12_4_ = 0; (int)p.mPath.field_2._12_4_ < 10;
      p.mPath.field_2._12_4_ = p.mPath.field_2._12_4_ + 1) {
    JetHead::Path::Path((Path *)local_38,partsTestData[(int)p.mPath.field_2._12_4_].path);
    JetHead::Path::parent();
    bVar2 = JetHead::Path::operator!=(&local_58,partsTestData[(int)p.mPath.field_2._12_4_].parent);
    JetHead::Path::~Path(&local_58);
    uVar1 = p.mPath.field_2._12_4_;
    if (bVar2) {
      JetHead::Path::parent();
      JetHead::Path::getString_abi_cxx11_(&local_88);
      uVar3 = std::__cxx11::string::c_str();
      TestCase::TestFailedInternal
                (&this->super_TestCase,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/PathTest.cpp"
                 ,0xac,"parent failed %d \"%s\"",(ulong)(uint)uVar1,uVar3);
      JetHead::Path::~Path(&local_88);
    }
    JetHead::Path::filename_abi_cxx11_();
    bVar2 = std::operator!=(&local_a8,partsTestData[(int)p.mPath.field_2._12_4_].filename);
    std::__cxx11::string::~string((string *)&local_a8);
    uVar1 = p.mPath.field_2._12_4_;
    if (bVar2) {
      JetHead::Path::filename_abi_cxx11_();
      uVar3 = std::__cxx11::string::c_str();
      TestCase::TestFailedInternal
                (&this->super_TestCase,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/PathTest.cpp"
                 ,0xae,"filename failed %d \"%s\"",(ulong)(uint)uVar1,uVar3);
      std::__cxx11::string::~string(local_c8);
    }
    JetHead::Path::fileBasename_abi_cxx11_();
    bVar2 = std::operator!=(&local_e8,partsTestData[(int)p.mPath.field_2._12_4_].fileBasename);
    std::__cxx11::string::~string((string *)&local_e8);
    uVar1 = p.mPath.field_2._12_4_;
    if (bVar2) {
      JetHead::Path::fileBasename_abi_cxx11_();
      uVar3 = std::__cxx11::string::c_str();
      TestCase::TestFailedInternal
                (&this->super_TestCase,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/PathTest.cpp"
                 ,0xb0,"fileBasename failed %d \"%s\"",(ulong)(uint)uVar1,uVar3);
      std::__cxx11::string::~string(local_108);
    }
    JetHead::Path::filenameExtention_abi_cxx11_();
    bVar2 = std::operator!=(&local_128,partsTestData[(int)p.mPath.field_2._12_4_].filenameExtention)
    ;
    std::__cxx11::string::~string((string *)&local_128);
    uVar1 = p.mPath.field_2._12_4_;
    if (bVar2) {
      JetHead::Path::filenameExtention_abi_cxx11_();
      uVar3 = std::__cxx11::string::c_str();
      TestCase::TestFailedInternal
                (&this->super_TestCase,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/PathTest.cpp"
                 ,0xb2,"filenameExtention failed %d \"%s\"",(ulong)(uint)uVar1,uVar3);
      std::__cxx11::string::~string(local_148);
    }
    JetHead::Path::~Path((Path *)local_38);
  }
  return;
}

Assistant:

void PathTest::PartsTest()
{
	for ( int i = 0; i < JH_ARRAY_SIZE( partsTestData ); i++ )
	{
		Path p( partsTestData[ i ].path );
		if ( p.parent() != partsTestData[ i ].parent )
			TestFailed( "parent failed %d \"%s\"", i, p.parent().getString().c_str() );
		if ( p.filename() != partsTestData[ i ].filename )
			TestFailed( "filename failed %d \"%s\"", i, p.filename().c_str() );
		if ( p.fileBasename() != partsTestData[ i ].fileBasename )
			TestFailed( "fileBasename failed %d \"%s\"", i, p.fileBasename().c_str() );
		if ( p.filenameExtention() != partsTestData[ i ].filenameExtention )
			TestFailed( "filenameExtention failed %d \"%s\"", i, p.filenameExtention().c_str() );
	}
}